

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall gulcalc::covoutputgul(gulcalc *this,gulcoverageSampleslevel *gg)

{
  OASIS_FLOAT OVar1;
  int iVar2;
  uchar *puVar3;
  
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    if (15999 < this->covbufoffset_) {
      (*this->coverageWriter_)(this->cbuf_,1,this->covbufoffset_);
      this->covbufoffset_ = 0;
    }
    if ((gg->event_id != lastcoverageheader.event_id) ||
       (gg->coverage_id != lastcoverageheader.item_id)) {
      if (this->isFirstCovEvent_ == false) {
        puVar3 = this->cbuf_ + this->covbufoffset_;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        puVar3[4] = '\0';
        puVar3[5] = '\0';
        puVar3[6] = '\0';
        puVar3[7] = '\0';
        this->covbufoffset_ = this->covbufoffset_ + 8;
      }
      else {
        this->isFirstCovEvent_ = false;
      }
      lastcoverageheader.event_id = gg->event_id;
      lastcoverageheader.item_id = gg->coverage_id;
      *(undefined8 *)(this->cbuf_ + this->covbufoffset_) = *(undefined8 *)gg;
      this->covbufoffset_ = this->covbufoffset_ + 8;
    }
    OVar1 = gg->loss;
    puVar3 = this->cbuf_;
    iVar2 = this->covbufoffset_;
    *(int *)(puVar3 + iVar2) = gg->sidx;
    *(OASIS_FLOAT *)(puVar3 + (long)iVar2 + 4) = OVar1;
    this->covbufoffset_ = this->covbufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::covoutputgul(gulcoverageSampleslevel &gg)
{
	if (coverageWriter_ == 0)  return;
	if (covbufoffset_ >= bufsize) {
		coverageWriter_(cbuf_,sizeof(unsigned char), covbufoffset_);
		covbufoffset_ = 0;
	}

	if (gg.event_id != lastcoverageheader.event_id || gg.coverage_id != lastcoverageheader.item_id) {
		if (isFirstCovEvent_ == false) {
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(cbuf_ + covbufoffset_, &r, sizeof(gulSampleslevelRec));
			covbufoffset_ += sizeof(gulSampleslevelRec);	// null terminate list
		}
		else {
			isFirstCovEvent_ = false;
		}
		lastcoverageheader.event_id = gg.event_id;
		lastcoverageheader.item_id = gg.coverage_id;
		memcpy(cbuf_ + covbufoffset_, &lastcoverageheader, sizeof(lastcoverageheader));
		covbufoffset_ += sizeof(lastcoverageheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;
	memcpy(cbuf_ + covbufoffset_, &r, sizeof(gulSampleslevelRec));
	covbufoffset_ += sizeof(gulSampleslevelRec);

}